

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL read_name(PCRE2_SPTR16 *ptrptr,PCRE2_SPTR16 ptrend,uint32_t terminator,size_t *offsetptr,
              PCRE2_SPTR16 *nameptr,uint32_t *namelenptr,int *errorcodeptr,compile_block_16 *cb)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  uint local_50;
  uint32_t ctype;
  uint32_t namelen;
  BOOL is_verb;
  PCRE2_SPTR16 ptr;
  uint32_t *namelenptr_local;
  PCRE2_SPTR16 *nameptr_local;
  size_t *offsetptr_local;
  uint32_t terminator_local;
  PCRE2_SPTR16 ptrend_local;
  PCRE2_SPTR16 *ptrptr_local;
  
  bVar3 = **ptrptr == 0x2a;
  local_50 = 0;
  bVar1 = 0x10;
  if (bVar3) {
    bVar1 = 2;
  }
  _namelen = *ptrptr + 1;
  if (_namelen < ptrend) {
    *nameptr = _namelen;
    *offsetptr = (long)_namelen - (long)cb->start_pattern >> 1;
    if ((*_namelen < 0x30) || (0x39 < *_namelen)) {
      do {
        bVar4 = false;
        if ((_namelen < ptrend) && (bVar4 = false, *_namelen < 0x100)) {
          bVar4 = (cb->ctypes[*_namelen] & bVar1) != 0;
        }
        if (!bVar4) {
          if (!bVar3) {
            if (local_50 == 0) {
              *errorcodeptr = 0xa2;
              goto LAB_0014ab99;
            }
            if ((ptrend <= _namelen) || ((uint)*_namelen != (terminator & 0xffff))) {
              *errorcodeptr = 0x8e;
              goto LAB_0014ab99;
            }
            _namelen = _namelen + 1;
          }
          *namelenptr = local_50;
          *ptrptr = _namelen;
          return 1;
        }
        _namelen = _namelen + 1;
        local_50 = local_50 + 1;
      } while (local_50 < 0x21);
      *errorcodeptr = 0x94;
    }
    else {
      *errorcodeptr = 0x90;
    }
  }
  else {
    iVar2 = 0xa2;
    if (bVar3) {
      iVar2 = 0xa0;
    }
    *errorcodeptr = iVar2;
  }
LAB_0014ab99:
  *ptrptr = _namelen;
  return 0;
}

Assistant:

static BOOL
read_name(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t terminator,
  PCRE2_SIZE *offsetptr, PCRE2_SPTR *nameptr, uint32_t *namelenptr,
  int *errorcodeptr, compile_block *cb)
{
PCRE2_SPTR ptr = *ptrptr;
BOOL is_verb = (*ptr == CHAR_ASTERISK);
uint32_t namelen = 0;
uint32_t ctype = is_verb? ctype_letter : ctype_word;

if (++ptr >= ptrend)
  {
  *errorcodeptr = is_verb? ERR60:  /* Verb not recognized or malformed */
                           ERR62;  /* Subpattern name expected */
  goto FAILED;
  }

*nameptr = ptr;
*offsetptr = (PCRE2_SIZE)(ptr - cb->start_pattern);

if (IS_DIGIT(*ptr))
  {
  *errorcodeptr = ERR44;   /* Group name must not start with digit */
  goto FAILED;
  }

while (ptr < ptrend && MAX_255(*ptr) && (cb->ctypes[*ptr] & ctype) != 0)
  {
  ptr++;
  namelen++;
  if (namelen > MAX_NAME_SIZE)
    {
    *errorcodeptr = ERR48;
    goto FAILED;
    }
  }

/* Subpattern names must not be empty, and their terminator is checked here.
(What follows a verb name is checked separately.) */

if (!is_verb)
  {
  if (namelen == 0)
    {
    *errorcodeptr = ERR62;   /* Subpattern name expected */
    goto FAILED;
    }
  if (ptr >= ptrend || *ptr != (PCRE2_UCHAR)terminator)
    {
    *errorcodeptr = ERR42;
    goto FAILED;
    }
  ptr++;
  }

*namelenptr = namelen;
*ptrptr = ptr;
return TRUE;

FAILED:
*ptrptr = ptr;
return FALSE;
}